

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

void __thiscall Preprocessor::substituteUntilNewline(Preprocessor *this,Symbols *substituted)

{
  qsizetype *index;
  Symbol *pSVar1;
  Data<QHashPrivate::Node<SubArray,_Macro>_> *this_00;
  bool bVar2;
  long lVar3;
  Token TVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  Bucket BVar7;
  Symbol definedOrNotDefined;
  SubArray local_90;
  Symbol local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (this->super_Parser).symbols.d.size;
  lVar5 = (this->super_Parser).index;
  if (lVar5 < lVar3) {
    index = &(this->super_Parser).index;
    do {
      lVar6 = lVar5 + 1;
      (this->super_Parser).index = lVar6;
      pSVar1 = (this->super_Parser).symbols.d.ptr;
      TVar4 = pSVar1[lVar5].token;
      if (TVar4 == IDENTIFIER) {
        local_68.lineNum = 0;
        local_68.token = NOTOKEN;
        macroExpand(substituted,this,(Symbols *)this,index,pSVar1[lVar5].lineNum,true,
                    (QSet<QByteArray> *)&local_68);
        QHash<QByteArray,_QHashDummyValue>::~QHash((QHash<QByteArray,_QHashDummyValue> *)&local_68);
      }
      else if (TVar4 == PP_DEFINED) {
        if ((lVar6 < lVar3) && (pSVar1[lVar6].token == LPAREN)) {
          lVar6 = lVar5 + 2;
          *index = lVar6;
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
        if ((lVar3 <= lVar6) || (pSVar1[lVar6].token != IDENTIFIER)) {
          Parser::error(&this->super_Parser,(char *)0x0);
        }
        *index = lVar6 + 1;
        local_68.lineNum = pSVar1[lVar6].lineNum;
        local_68.token = pSVar1[lVar6].token;
        local_68.lex.d.d = pSVar1[lVar6].lex.d.d;
        local_90.array.d.ptr = pSVar1[lVar6].lex.d.ptr;
        local_90.array.d.size = pSVar1[lVar6].lex.d.size;
        if (&(local_68.lex.d.d)->super_QArrayData == (QArrayData *)0x0) {
          local_90.array.d.d = (Data *)0x0;
        }
        else {
          LOCK();
          (((QArrayData *)&((local_68.lex.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_68.lex.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
          local_90.array.d.d = local_68.lex.d.d;
        }
        local_90.from = pSVar1[lVar6].from;
        local_90.len = pSVar1[lVar6].len;
        if (&(local_90.array.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_90.array.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_90.array.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        this_00 = (this->macros).d;
        TVar4 = PP_MOC_FALSE;
        local_68.lex.d.ptr = local_90.array.d.ptr;
        local_68.lex.d.size = local_90.array.d.size;
        local_68.from = local_90.from;
        local_68.len = local_90.len;
        if (this_00 != (Data<QHashPrivate::Node<SubArray,_Macro>_> *)0x0) {
          BVar7 = QHashPrivate::Data<QHashPrivate::Node<SubArray,_Macro>_>::findBucket<SubArray>
                            (this_00,&local_90);
          if ((BVar7.span)->offsets[BVar7.index] != 0xff) {
            TVar4 = ((BVar7.span)->entries == (Entry *)0x0) + PP_MOC_TRUE;
          }
        }
        local_68.token = TVar4;
        if (&(local_90.array.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_90.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_90.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if (((local_90.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_90.array.d.d)->super_QArrayData,1,0x10);
          }
        }
        QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
                  ((QMovableArrayOps<Symbol> *)substituted,(substituted->d).size,&local_68);
        QList<Symbol>::end(substituted);
        if (((bVar2) &&
            (lVar3 = (this->super_Parser).index, lVar3 < (this->super_Parser).symbols.d.size)) &&
           ((this->super_Parser).symbols.d.ptr[lVar3].token == PP_RPAREN)) {
          *index = lVar3 + 1;
        }
        if (&(local_68.lex.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_68.lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate(&(local_68.lex.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
      else {
        if (TVar4 == NEWLINE) {
          QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
                    ((QMovableArrayOps<Symbol> *)substituted,(substituted->d).size,pSVar1 + lVar5);
          QList<Symbol>::end(substituted);
          break;
        }
        QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
                  ((QMovableArrayOps<Symbol> *)substituted,(substituted->d).size,pSVar1 + lVar5);
        QList<Symbol>::end(substituted);
      }
      lVar3 = (this->super_Parser).symbols.d.size;
      lVar5 = (this->super_Parser).index;
    } while (lVar5 < lVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Preprocessor::substituteUntilNewline(Symbols &substituted)
{
    while (hasNext()) {
        Token token = next();
        if (token == PP_IDENTIFIER) {
            macroExpand(&substituted, this, symbols, index, symbol().lineNum, true);
        } else if (token == PP_DEFINED) {
            bool braces = test(PP_LPAREN);
            next(PP_IDENTIFIER);
            Symbol definedOrNotDefined = symbol();
            definedOrNotDefined.token = macros.contains(definedOrNotDefined)? PP_MOC_TRUE : PP_MOC_FALSE;
            substituted += definedOrNotDefined;
            if (braces)
                test(PP_RPAREN);
            continue;
        } else if (token == PP_NEWLINE) {
            substituted += symbol();
            break;
        } else {
            substituted += symbol();
        }
    }
}